

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O1

void phmap::priv::(anonymous_namespace)::CheckPairEquals<std::__cxx11::string,std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *y)

{
  size_t __n;
  int iVar1;
  
  __n = x->_M_string_length;
  if (__n == y->_M_string_length) {
    if (__n != 0) {
      iVar1 = bcmp((x->_M_dataplus)._M_p,(y->_M_dataplus)._M_p,__n);
      if (iVar1 != 0) goto LAB_0012ac59;
    }
    return;
  }
LAB_0012ac59:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                ,0x49,
                "void phmap::priv::(anonymous namespace)::CheckPairEquals(const T &, const U &) [T = std::basic_string<char>, U = std::basic_string<char>]"
               );
}

Assistant:

void CheckPairEquals(const T &x, const U &y) {
        PHMAP_INTERNAL_CHECK(x == y, "Values are unequal.");
    }